

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<int,_QXcbConnection::TouchDeviceData>_>::Data
          (Data<QHashPrivate::Node<int,_QXcbConnection::TouchDeviceData>_> *this,
          Data<QHashPrivate::Node<int,_QXcbConnection::TouchDeviceData>_> *other)

{
  long lVar1;
  bool bVar2;
  long in_RSI;
  Span<QHashPrivate::Node<int,_QXcbConnection::TouchDeviceData>_> *in_RDI;
  long in_FS_OFFSET;
  R RVar3;
  Node<int,_QXcbConnection::TouchDeviceData> *newNode;
  Node<int,_QXcbConnection::TouchDeviceData> *n;
  size_t index;
  Span *span;
  size_t s;
  R r;
  Bucket it;
  QBasicAtomicInteger<int> *in_stack_ffffffffffffff80;
  Span<QHashPrivate::Node<int,_QXcbConnection::TouchDeviceData>_> *this_00;
  ulong local_58;
  ulong local_48;
  size_t in_stack_ffffffffffffffc0;
  Span *local_28;
  size_t local_20;
  Bucket local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QBasicAtomicInteger<int>::QBasicAtomicInteger
            (in_stack_ffffffffffffff80,(int)((ulong)in_RDI >> 0x20));
  ((TouchDeviceData *)((long)in_RDI->offsets + 8))->qtTouchDevice =
       *(QPointingDevice **)(in_RSI + 8);
  ((QHash<int,_QWindowSystemInterface::TouchPoint> *)((long)in_RDI->offsets + 0x10))->d =
       *(Data **)(in_RSI + 0x10);
  ((QHash<int,_QPointF> *)((long)in_RDI->offsets + 0x18))->d = *(Data **)(in_RSI + 0x18);
  (((QList<QXcbConnection::TouchDeviceData::ValuatorClassInfo> *)((long)in_RDI->offsets + 0x20))->d)
  .d = (Data *)0x0;
  RVar3 = allocateSpans(in_stack_ffffffffffffffc0);
  local_28 = RVar3.spans;
  (((QList<QXcbConnection::TouchDeviceData::ValuatorClassInfo> *)((long)in_RDI->offsets + 0x20))->d)
  .d = (Data *)local_28;
  local_20 = RVar3.nSpans;
  this_00 = in_RDI;
  for (local_48 = 0; local_48 < local_20; local_48 = local_48 + 1) {
    lVar1 = *(long *)(in_RSI + 0x20);
    for (local_58 = 0; local_58 < 0x80; local_58 = local_58 + 1) {
      bVar2 = Span<QHashPrivate::Node<int,_QXcbConnection::TouchDeviceData>_>::hasNode
                        ((Span<QHashPrivate::Node<int,_QXcbConnection::TouchDeviceData>_> *)
                         (lVar1 + local_48 * 0x90),local_58);
      if (bVar2) {
        Span<QHashPrivate::Node<int,_QXcbConnection::TouchDeviceData>_>::at(this_00,(size_t)in_RDI);
        local_18.span = (Span *)0xaaaaaaaaaaaaaaaa;
        local_18.index = 0xaaaaaaaaaaaaaaaa;
        Bucket::Bucket(&local_18,(Span *)(*(long *)(this_00->offsets + 0x20) + local_48 * 0x90),
                       local_58);
        Bucket::insert((Bucket *)0x18ba6b);
        Node<int,_QXcbConnection::TouchDeviceData>::Node
                  ((Node<int,_QXcbConnection::TouchDeviceData> *)this_00,
                   (Node<int,_QXcbConnection::TouchDeviceData> *)in_RDI);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }